

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIndexedStateQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::BlendFuncCase::init(BlendFuncCase *this,EVP_PKEY_CTX *ctx)

{
  Context *context;
  int iVar1;
  allocator<char> local_31;
  string local_30;
  BlendFuncCase *local_10;
  BlendFuncCase *this_local;
  
  context = (this->super_TestCase).m_context;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"GL_EXT_draw_buffers_indexed",&local_31);
  isExtensionSupported(context,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  iVar1 = std::allocator<char>::~allocator(&local_31);
  return iVar1;
}

Assistant:

void BlendFuncCase::init (void)
{
	isExtensionSupported(m_context, "GL_EXT_draw_buffers_indexed");
}